

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::rc::TextureCubeArray::sample4
          (TextureCubeArray *this,Vec4 *output,Vec4 *packetTexcoords,float lodBias)

{
  undefined8 *puVar1;
  Vector<float,_2> *b;
  CubeFace CVar2;
  ulong uVar3;
  long lVar4;
  ulong *puVar5;
  float *this_00;
  ulong *puVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  Vec2 dFdx0;
  Vec3 cubeCoords [4];
  Vec2 faceCoords [4];
  Vec2 dFdy1;
  Vec2 dFdy0;
  Vec2 dFdx1;
  ulong local_b0;
  float local_a8 [3];
  undefined1 local_9c [24];
  undefined1 local_84 [20];
  Vector<float,_2> local_70;
  Vector<float,_2> local_68;
  Vector<float,_2> local_60;
  _func_int **local_58;
  undefined8 uStack_50;
  
  if ((this->m_view).m_numLevels < 1) {
    fVar9 = 0.0;
  }
  else {
    fVar9 = (float)(((this->m_view).m_levels)->m_size).m_data[0];
  }
  this_00 = local_a8;
  tcu::Vector<float,_4>::toWidth<3>((Vector<float,_4> *)this_00);
  tcu::Vector<float,_4>::toWidth<3>((Vector<float,_4> *)local_9c);
  tcu::Vector<float,_4>::toWidth<3>((Vector<float,_4> *)(local_9c + 0xc));
  tcu::Vector<float,_4>::toWidth<3>((Vector<float,_4> *)local_84);
  lVar4 = 0;
  for (uVar3 = 0; uVar3 != 4; uVar3 = uVar3 + 1) {
    CVar2 = tcu::selectCubeFace((Vec3 *)this_00);
    b = (Vector<float,_2> *)(local_84 + 0xc);
    tcu::projectToFace((CubeFace)b,(Vec3 *)(ulong)CVar2);
    tcu::projectToFace((CubeFace)&local_70,(Vec3 *)(ulong)CVar2);
    tcu::projectToFace((CubeFace)&local_68,(Vec3 *)(ulong)CVar2);
    tcu::projectToFace((CubeFace)&local_60,(Vec3 *)(ulong)CVar2);
    tcu::operator-(&local_70,b);
    tcu::operator-(&local_60,&local_68);
    tcu::operator-(&local_68,b);
    tcu::operator-(&local_60,&local_70);
    puVar5 = (ulong *)&stack0xffffffffffffffc8;
    if (uVar3 < 2) {
      puVar5 = &local_b0;
    }
    puVar6 = (ulong *)&stack0xffffffffffffffb8;
    if ((uVar3 & 1) == 0) {
      puVar6 = (ulong *)&stack0xffffffffffffffc0;
    }
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *puVar5;
    auVar10._0_8_ = *puVar5 ^ 0x8000000080000000;
    auVar10._8_4_ = 0x80000000;
    auVar10._12_4_ = 0x80000000;
    auVar11 = maxps(auVar10,auVar11);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *puVar6;
    auVar12._0_8_ = *puVar6 ^ 0x8000000080000000;
    auVar12._8_4_ = 0x80000000;
    auVar12._12_4_ = 0x80000000;
    auVar13 = maxps(auVar12,auVar13);
    uVar7 = -(uint)(auVar13._0_4_ <= auVar11._0_4_);
    uVar8 = -(uint)(auVar13._4_4_ <= auVar11._4_4_);
    fVar14 = (float)(~uVar7 & (uint)auVar13._0_4_ | (uint)auVar11._0_4_ & uVar7) * fVar9;
    fVar15 = (float)(~uVar8 & (uint)auVar13._4_4_ | (uint)auVar11._4_4_ & uVar8) * fVar9;
    uVar7 = -(uint)(fVar15 <= fVar14);
    fVar14 = deFloatLog2((float)(~uVar7 & (uint)fVar15 | (uint)fVar14 & uVar7));
    sample((TextureCubeArray *)&stack0xffffffffffffffa8,
           *(float *)((long)packetTexcoords->m_data + lVar4),
           *(float *)((long)packetTexcoords->m_data + lVar4 + 4),
           *(float *)((long)packetTexcoords->m_data + lVar4 + 8),
           *(float *)((long)packetTexcoords->m_data + lVar4 + 0xc),fVar14 + lodBias);
    puVar1 = (undefined8 *)((long)output->m_data + lVar4);
    *puVar1 = local_58;
    puVar1[1] = uStack_50;
    lVar4 = lVar4 + 0x10;
    this_00 = this_00 + 3;
  }
  return;
}

Assistant:

void TextureCubeArray::sample4 (tcu::Vec4 output[4], const tcu::Vec4 packetTexcoords[4], float lodBias) const
{
	const float		cubeSide		= (float)m_view.getSize();
	const tcu::Vec3	cubeCoords[4]	=
	{
		packetTexcoords[0].toWidth<3>(),
		packetTexcoords[1].toWidth<3>(),
		packetTexcoords[2].toWidth<3>(),
		packetTexcoords[3].toWidth<3>()
	};

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::CubeFace face			= tcu::selectCubeFace(cubeCoords[fragNdx]);
		const tcu::Vec2		faceCoords[4]	=
		{
			tcu::projectToFace(face, cubeCoords[0]),
			tcu::projectToFace(face, cubeCoords[1]),
			tcu::projectToFace(face, cubeCoords[2]),
			tcu::projectToFace(face, cubeCoords[3]),
		};

		const tcu::Vec2 dFdx0 = faceCoords[1] - faceCoords[0];
		const tcu::Vec2 dFdx1 = faceCoords[3] - faceCoords[2];
		const tcu::Vec2 dFdy0 = faceCoords[2] - faceCoords[0];
		const tcu::Vec2 dFdy1 = faceCoords[3] - faceCoords[1];

		const tcu::Vec2& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec2& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * cubeSide, mv * cubeSide);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), packetTexcoords[fragNdx].w(), lod);
	}
}